

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O3

Status __thiscall BehaviourTree::Invert::run(Invert *this)

{
  Node *pNVar1;
  Status SVar2;
  
  pNVar1 = (this->super_DecoratorNode).child;
  if (pNVar1->_dontSkip == true) {
    SVar2 = (*pNVar1->_vptr_Node[2])();
    (this->super_DecoratorNode).super_Node._lastStatus = SVar2;
  }
  else if (pNVar1->_completed == true) {
    SVar2 = pNVar1->_lastStatus;
  }
  else {
    SVar2 = (*pNVar1->_vptr_Node[2])();
    (this->super_DecoratorNode).super_Node._lastStatus = SVar2;
    if (SVar2 == RUNNING) {
      return RUNNING;
    }
    (this->super_DecoratorNode).super_Node._completed = true;
  }
  if (SVar2 == SUCCESS) {
    SVar2 = FAILURE;
  }
  else if (SVar2 == FAILURE) {
    SVar2 = SUCCESS;
  }
  return SVar2;
}

Assistant:

virtual Status run() override {
			Node* child = getChild();
			if (child->dontSkip()) {
				// run at each and every iteration
				const Status s = child->run();
				_lastStatus = s;
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
			else {
				// if the job has already been done, return the status
				// else execute it
				Status s;
				if (child->isCompleted()) {
					s = child->getLastStatus();
				}
				else {
					s = child->run();
					_lastStatus = s;
					if (s != Status::RUNNING)
						_completed = true;
				}
				switch (s)
				{
				case Status::SUCCESS: return Status::FAILURE;
				case Status::FAILURE: return Status::SUCCESS;
				default: return s;
				}
			}
		}